

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int select_negotiated_group
              (ptls_key_exchange_algorithm_t **selected,ptls_key_exchange_algorithm_t **candidates,
              uint8_t *src,uint8_t *end)

{
  int iVar1;
  uint16_t *value;
  uint16_t *in_RCX;
  uint16_t *in_RDX;
  uint16_t *puVar2;
  long *in_RSI;
  long *in_RDI;
  ptls_key_exchange_algorithm_t **c;
  uint16_t group;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  long *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  short in_stack_ffffffffffffffa6;
  ulong local_40;
  long local_38;
  int local_2c;
  uint16_t *local_20;
  
  local_38 = 2;
  if ((ulong)((long)in_RCX - (long)in_RDX) < 2) {
    local_2c = 0x32;
  }
  else {
    local_40 = 0;
    local_20 = in_RDX;
    do {
      puVar2 = (uint16_t *)((long)local_20 + 1);
      local_40 = local_40 << 8 | (ulong)(byte)*local_20;
      local_38 = local_38 + -1;
      local_20 = puVar2;
    } while (local_38 != 0);
    if ((ulong)((long)in_RCX - (long)puVar2) < local_40) {
      local_2c = 0x32;
    }
    else {
      value = (uint16_t *)((long)puVar2 + local_40);
      while (puVar2 != value) {
        iVar1 = ptls_decode16(value,(uint8_t **)
                                    CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),
                              (uint8_t *)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff98 = in_RSI;
        if (iVar1 != 0) {
          return iVar1;
        }
        for (; *in_stack_ffffffffffffff98 != 0;
            in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1) {
          if (*(short *)*in_stack_ffffffffffffff98 == in_stack_ffffffffffffffa6) {
            *in_RDI = *in_stack_ffffffffffffff98;
            return 0;
          }
        }
      }
      if (puVar2 == value) {
        if (puVar2 == in_RCX) {
          local_2c = 0x28;
        }
        else {
          local_2c = 0x32;
        }
      }
      else {
        local_2c = 0x32;
      }
    }
  }
  return local_2c;
}

Assistant:

static int select_negotiated_group(ptls_key_exchange_algorithm_t **selected, ptls_key_exchange_algorithm_t **candidates,
                                   const uint8_t *src, const uint8_t *const end)
{
    int ret;

    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t group;
            if ((ret = ptls_decode16(&group, &src, end)) != 0)
                goto Exit;
            ptls_key_exchange_algorithm_t **c = candidates;
            for (; *c != NULL; ++c) {
                if ((*c)->id == group) {
                    *selected = *c;
                    return 0;
                }
            }
        }
    });

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}